

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v6::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  string_view message;
  int extraout_EAX;
  int iVar1;
  runtime_error *base;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_00;
  string local_2e0 [24];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [71];
  allocator<char> local_249 [517];
  int in_stack_ffffffffffffffbc;
  buffer<char> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8 [12];
  
  iVar1 = (int)ctx;
  this->error_code_ = iVar1;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::allocator<char>::~allocator(local_249);
  vformat<fmt::v6::basic_string_view<char>,char>
            ((basic_string_view<char> *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
  s = local_290;
  basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffffd00,s);
  this_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_249 + 1);
  message.size_._4_4_ = iVar1;
  message._0_12_ = in_stack_ffffffffffffffc8;
  format_system_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,message);
  std::__cxx11::string::~string((string *)s);
  to_string<char,500ul>(in_stack_fffffffffffffd38);
  std::runtime_error::runtime_error((runtime_error *)&stack0xfffffffffffffd40,local_2e0);
  std::runtime_error::operator=
            (&this->super_runtime_error,(runtime_error *)&stack0xfffffffffffffd40);
  std::runtime_error::~runtime_error((runtime_error *)&stack0xfffffffffffffd40);
  std::__cxx11::string::~string(local_2e0);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}